

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

nifti_image * nt_read_bricks(nt_opts *opts,char *fname,int len,int *list,nifti_brick_list *NBL)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  uint local_44;
  int c;
  nifti_image *nim;
  nifti_brick_list *NBL_local;
  int *list_local;
  int len_local;
  char *fname_local;
  nt_opts *opts_local;
  
  if (((opts == (nt_opts *)0x0) || (fname == (char *)0x0)) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nt_read_bricks: bad params (%p,%p,%p)\n",opts,fname,NBL);
    opts_local = (nt_opts *)0x0;
  }
  else {
    iVar1 = strncmp(fname,"MAKE_IM",7);
    if (iVar1 == 0) {
      if ((1 < g_debug) &&
         (fprintf(_stderr,"+d NT_RB: generating EMPTY IMAGE from %s...\n",fname), 2 < g_debug)) {
        printf("   new_dim[8] = ");
        disp_raw_data(opts->new_dim,8,8,' ',1);
        printf("   new_datatype = %d\n",(ulong)(uint)opts->new_datatype);
        if ((list != (int *)0x0) && (0 < len)) {
          printf("   brick_list[%d] = ",(ulong)(uint)len);
          disp_raw_data(list,8,len,' ',1);
        }
        fflush(_stdout);
      }
      opts_local = (nt_opts *)nifti_make_new_nim(opts->new_dim,opts->new_datatype,0);
      if (opts_local == (nt_opts *)0x0) {
        fprintf(_stderr,"** nt_read_bricks, nifti_make_new_nim failure\n");
        opts_local = (nt_opts *)0x0;
      }
      else {
        NBL->nbricks = len;
        NBL->bsize = (long)opts_local->dts * (long)opts_local->check_nim *
                     (long)opts_local->diff_hdr * (long)opts_local->diff_nim;
        ppvVar2 = (void **)calloc((long)NBL->nbricks,8);
        NBL->bricks = ppvVar2;
        if (NBL->bricks == (void **)0x0) {
          fprintf(_stderr,"** NRB: failed to alloc %d pointers\n",(ulong)(uint)NBL->nbricks);
          nifti_image_free((nifti_image *)opts_local);
          opts_local = (nt_opts *)0x0;
        }
        else {
          if (1 < g_debug) {
            fprintf(_stderr,"+d NRB, allocating %d bricks of %u bytes...\n",
                    (ulong)(uint)NBL->nbricks,NBL->bsize & 0xffffffff);
          }
          for (local_44 = 0; (int)local_44 < len; local_44 = local_44 + 1) {
            pvVar3 = calloc(1,NBL->bsize);
            NBL->bricks[(int)local_44] = pvVar3;
            if (NBL->bricks[(int)local_44] == (void *)0x0) {
              fprintf(_stderr,"** NRB: failed to alloc brick %d of %u bytes\n",(ulong)local_44,
                      NBL->bsize & 0xffffffff);
              nifti_free_NBL(NBL);
              nifti_image_free((nifti_image *)opts_local);
              return (nifti_image *)0x0;
            }
          }
        }
      }
    }
    else {
      if (1 < g_debug) {
        fprintf(_stderr,"-d calling nifti_image_read_bricks(%s,...)\n",fname);
      }
      opts_local = (nt_opts *)nifti_image_read_bricks(fname,len,list,NBL);
    }
  }
  return (nifti_image *)opts_local;
}

Assistant:

nifti_image * nt_read_bricks(nt_opts * opts, char * fname, int len, int * list,
                             nifti_brick_list * NBL)
{
    nifti_image * nim;
    int           c;

    /* swapped is not necessary */
    if( !opts || !fname || !NBL ) {
        fprintf(stderr,"** nt_read_bricks: bad params (%p,%p,%p)\n",
                (void *)opts, (void *)fname, (void *)NBL);
        return NULL;
    }

    /* if the user does not want an empty image, do normal read_bricks */
    if( strncmp(fname,NT_MAKE_IM_NAME,strlen(NT_MAKE_IM_NAME)) ) {
        if(g_debug > 1)
           fprintf(stderr,"-d calling nifti_image_read_bricks(%s,...)\n",fname);
        return nifti_image_read_bricks(fname, len, list, NBL);
    }

    /* so generate an emtpy image */
    if(g_debug > 1) {
        fprintf(stderr,"+d NT_RB: generating EMPTY IMAGE from %s...\n",fname);
        if(g_debug > 2) {
            printf("   new_dim[8] = ");
            disp_raw_data(opts->new_dim, DT_INT32, 8, ' ', 1);
            printf("   new_datatype = %d\n", opts->new_datatype);
            if( list && len > 0 ) {
                printf("   brick_list[%d] = ", len);
                disp_raw_data(list, DT_INT32, len, ' ', 1);
            }
            fflush(stdout);  /* disp_raw_data uses stdout */
        }
    }

    /* first, get nim struct without data */
    nim = nifti_make_new_nim(opts->new_dim, opts->new_datatype, 0);
    if( !nim ) {
        fprintf(stderr,"** nt_read_bricks, nifti_make_new_nim failure\n");
        return NULL;
    }

    /* now populate NBL (can be based only on len and nim) */
    NBL->nbricks = len;
    NBL->bsize = (size_t)nim->nbyper * nim->nx * nim->ny * nim->nz;
    NBL->bricks = (void **)calloc(NBL->nbricks, sizeof(void *));
    if( !NBL->bricks ){
        fprintf(stderr,"** NRB: failed to alloc %d pointers\n",NBL->nbricks);
        nifti_image_free(nim);
        return NULL;
    }

    if(g_debug > 1)
        fprintf(stderr,"+d NRB, allocating %d bricks of %u bytes...\n",
                NBL->nbricks, (unsigned)NBL->bsize);

    /* now allocate the data pointers */
    for( c = 0; c < len; c++ ) {
        NBL->bricks[c] = calloc(1, NBL->bsize);
        if( !NBL->bricks[c] ){
            fprintf(stderr,"** NRB: failed to alloc brick %d of %u bytes\n",
                    c, (unsigned)NBL->bsize);
            nifti_free_NBL(NBL); nifti_image_free(nim); return NULL;
        }
    }

    return nim;
}